

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void __thiscall CSocekt::clearconnection(CSocekt *this)

{
  value_type pfVar1;
  bool bVar2;
  reference ppfVar3;
  CMemory *in_RDI;
  CMemory *p_memory;
  lp_connection_t p_Conn;
  void *in_stack_ffffffffffffffd8;
  
  CMemory::GetInstance();
  while( true ) {
    bVar2 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::empty
                      ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                       (in_RDI + 0x78));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppfVar3 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::front
                        ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)in_RDI);
    pfVar1 = *ppfVar3;
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::pop_front
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)in_RDI);
    (**pfVar1->_vptr_flyd_connection_s)();
    CMemory::FreeMemory(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void CSocekt::clearconnection()
{
    lp_connection_t p_Conn;
	CMemory *p_memory = CMemory::GetInstance(); //获得单例对象的指针
	
	while(!m_connectionList.empty())
	{
		p_Conn = m_connectionList.front();
		m_connectionList.pop_front(); 
        p_Conn->~flyd_connection_t();     //手工调用析构函数
		p_memory->FreeMemory(p_Conn);
	}
}